

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.h
# Opt level: O0

EncodingResult<kj::String> *
kj::decodeUriComponent(EncodingResult<kj::String> *__return_storage_ptr__,ArrayPtr<const_char> text)

{
  DecodeUriOptions in_R8W;
  ArrayPtr<const_char> text_00;
  Array<char> local_90;
  String local_78;
  DecodeUriOptions local_5a;
  kj *local_58;
  size_t sStack_50;
  undefined1 local_40 [8];
  EncodingResult<kj::Array<unsigned_char>_> result;
  ArrayPtr<const_char> text_local;
  
  sStack_50 = text.size_;
  local_58 = (kj *)text.ptr;
  result._24_8_ = local_58;
  DecodeUriOptions::DecodeUriOptions(&local_5a,true,false);
  text_00.size_._0_2_ = local_5a;
  text_00.ptr = (char *)sStack_50;
  text_00.size_._2_6_ = 0;
  decodeBinaryUriComponent
            ((EncodingResult<kj::Array<unsigned_char>_> *)local_40,local_58,text_00,in_R8W);
  Array<unsigned_char>::releaseAsChars(&local_90,(Array<unsigned_char> *)local_40);
  String::String(&local_78,&local_90);
  EncodingResult<kj::String>::EncodingResult
            (__return_storage_ptr__,&local_78,
             (bool)((byte)result.super_Array<unsigned_char>.disposer & 1));
  String::~String(&local_78);
  Array<char>::~Array(&local_90);
  EncodingResult<kj::Array<unsigned_char>_>::~EncodingResult
            ((EncodingResult<kj::Array<unsigned_char>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline EncodingResult<String> decodeUriComponent(ArrayPtr<const char> text) {
  auto result = decodeBinaryUriComponent(text, DecodeUriOptions { /*.nulTerminate=*/true });
  return { String(result.releaseAsChars()), result.hadErrors };
}